

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void CVmObjBigNum::shift_left(char *ext,uint shift)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  if (shift != 0) {
    uVar2 = (ulong)shift;
    uVar1 = *(ushort *)ext;
    uVar9 = (ulong)uVar1;
    if ((shift & 1) == 0) {
      uVar7 = (ulong)(shift >> 1);
      uVar6 = (ulong)(uVar1 + 1 >> 1);
      if (uVar7 < uVar6) {
        uVar5 = 0;
        do {
          ext[uVar5 + 5] = ext[uVar5 + uVar7 + 5];
          uVar5 = uVar5 + 1;
        } while (uVar6 - uVar7 != uVar5);
      }
      else {
        uVar5 = 0;
      }
      if (uVar5 <= uVar6 && uVar6 - uVar5 != 0) {
        memset(ext + uVar5 + 5,0,uVar6 - uVar5);
      }
      ext[(uVar9 - uVar2 >> 1) + 5] =
           ext[(uVar9 - uVar2 >> 1) + 5] & '\x0f' << (((byte)uVar1 & 1) << 2);
    }
    else {
      if (uVar2 < uVar9) {
        iVar8 = shift << 2;
        uVar7 = 0;
        do {
          bVar3 = (byte)uVar7 & 1;
          ext[(uVar7 >> 1) + 5] =
               (byte)(((uint)(int)ext[(uVar2 + uVar7 >> 1) + 5] >> (~(byte)iVar8 & 4) & 0xf) <<
                     (bVar3 * '\x04' ^ 4)) | '\x0f' << (bVar3 << 2) & ext[(uVar7 >> 1) + 5];
          uVar7 = uVar7 + 1;
          iVar8 = iVar8 + 4;
        } while ((uVar2 - uVar9) + uVar7 != 0);
      }
      else {
        uVar7 = 0;
      }
      if (uVar7 < uVar9) {
        uVar4 = (int)uVar7 * 4;
        do {
          ext[(uVar7 >> 1) + 5] = ext[(uVar7 >> 1) + 5] & '\x0f' << ((byte)uVar4 & 4);
          uVar7 = uVar7 + 1;
          uVar4 = (uint)(byte)((byte)uVar4 + 4);
        } while (uVar9 != uVar7);
      }
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::shift_left(char *ext, unsigned int shift)
{
    size_t prec = get_prec(ext);
    size_t i;

    /* do nothing with a zero shift */
    if (shift == 0)
        return;

    /* if it's an even shift, it's especially easy */
    if ((shift & 1) == 0)
    {
        /* simply move the bytes left by the required amount */
        for (i = 0 ; i + shift/2 < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = ext[VMBN_MANT + i + shift/2];

        /* zero the remaining digits */
        for ( ; i < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = 0;

        /* 
         *   be sure to zero the last digit - if we have an odd precision, we
         *   will have copied the garbage digit from the final half-byte 
         */
        set_dig(ext, prec - shift, 0);
    }
    else
    {
        /* apply the shift to each digit */
        for (i = 0 ; i + shift < prec  ; ++i)
        {
            unsigned int dig;

            /* get this source digit */
            dig = get_dig(ext, i + shift);

            /* set this destination digit */
            set_dig(ext, i, dig);
        }

        /* zero the remaining digits */
        for ( ; i < prec ; ++i)
            set_dig(ext, i, 0);
    }
}